

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::handleAttributesPSVI
          (AbstractDOMParser *this,XMLCh *localName,XMLCh *uri,PSVIAttributeList *psviAttributes)

{
  DOMDocumentImpl *pDVar1;
  byte bVar2;
  int iVar3;
  VALIDITY_STATE VVar4;
  ASSESSMENT_TYPE AVar5;
  PSVIAttribute *pPVar6;
  undefined4 extraout_var;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  long *plVar9;
  DOMDocument *doc;
  DOMTypeInfoImpl *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  DOMTypeInfoImpl *typeInfo;
  DOMNode *pAttrNode;
  PSVIAttribute *attrInfo;
  XMLSize_t index;
  PSVIAttributeList *psviAttributes_local;
  XMLCh *uri_local;
  XMLCh *localName_local;
  AbstractDOMParser *this_local;
  
  if ((this->fCreateSchemaInfo & 1U) != 0) {
    for (attrInfo = (PSVIAttribute *)0x0;
        pPVar6 = (PSVIAttribute *)PSVIAttributeList::getLength(psviAttributes), attrInfo < pPVar6;
        attrInfo = (PSVIAttribute *)((long)&(attrInfo->super_PSVIItem)._vptr_PSVIItem + 1)) {
      pPVar6 = PSVIAttributeList::getAttributePSVIAtIndex(psviAttributes,(XMLSize_t)attrInfo);
      iVar3 = (*this->fCurrentNode->_vptr_DOMNode[0xb])();
      pXVar7 = PSVIAttributeList::getAttributeNamespaceAtIndex(psviAttributes,(XMLSize_t)attrInfo);
      pXVar8 = PSVIAttributeList::getAttributeNameAtIndex(psviAttributes,(XMLSize_t)attrInfo);
      plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
                                 ((long *)CONCAT44(extraout_var,iVar3),pXVar7,pXVar8);
      if (plVar9 != (long *)0x0) {
        doc = getDocument(this);
        this_00 = (DOMTypeInfoImpl *)operator_new(0x48,doc);
        DOMTypeInfoImpl::DOMTypeInfoImpl(this_00,(XMLCh *)0x0,(XMLCh *)0x0);
        VVar4 = PSVIItem::getValidity(&pPVar6->super_PSVIItem);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,0,(ulong)VVar4);
        AVar5 = PSVIItem::getValidationAttempted(&pPVar6->super_PSVIItem);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,1,(ulong)AVar5);
        iVar3 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[2])();
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          VVar4 = PSVIItem::getValidity(&pPVar6->super_PSVIItem);
          if (VVar4 == VALIDITY_VALID) {
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,0x10);
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,0);
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                      (this_00,4,SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                      (this_00,3,SchemaSymbols::fgDT_ANYSIMPLETYPE);
          }
        }
        else {
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,0x10);
          iVar3 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[2])();
          bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x38))();
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,(ulong)(bVar2 & 1));
          pDVar1 = this->fDocument;
          iVar3 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[2])();
          pXVar7 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x18))();
          pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,4,pXVar7);
          pDVar1 = this->fDocument;
          iVar3 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[2])();
          pXVar7 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x10))();
          pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,3,pXVar7);
        }
        iVar3 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[3])();
        if (CONCAT44(extraout_var_04,iVar3) != 0) {
          iVar3 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[3])();
          bVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x38))();
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,9,(ulong)(bVar2 & 1));
          pDVar1 = this->fDocument;
          iVar3 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[3])();
          pXVar7 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x18))();
          pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,8,pXVar7);
          pDVar1 = this->fDocument;
          iVar3 = (*(pPVar6->super_PSVIItem)._vptr_PSVIItem[3])();
          pXVar7 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x10))();
          pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,7,pXVar7);
        }
        pDVar1 = this->fDocument;
        pXVar7 = PSVIItem::getSchemaDefault(&pPVar6->super_PSVIItem);
        pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,10,pXVar7);
        pDVar1 = this->fDocument;
        pXVar7 = PSVIItem::getSchemaNormalizedValue(&pPVar6->super_PSVIItem);
        pXVar7 = DOMDocumentImpl::getPooledString(pDVar1,pXVar7);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,0xb,pXVar7);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,0xc,1);
        (**(code **)(*plVar9 + 0x1a8))(plVar9,this_00);
      }
    }
  }
  if (this->fPSVIHandler != (PSVIHandler *)0x0) {
    (*this->fPSVIHandler->_vptr_PSVIHandler[4])(this->fPSVIHandler,localName,uri,psviAttributes);
  }
  return;
}

Assistant:

void AbstractDOMParser::handleAttributesPSVI( const XMLCh* const            localName
                                            , const XMLCh* const            uri
                                            ,       PSVIAttributeList *     psviAttributes)
{
    if(fCreateSchemaInfo)
    {
        for (XMLSize_t index=0; index < psviAttributes->getLength(); index++) {
            xercesc::PSVIAttribute *attrInfo=psviAttributes->getAttributePSVIAtIndex(index);
            xercesc::DOMNode* pAttrNode=fCurrentNode->getAttributes()->getNamedItemNS(psviAttributes->getAttributeNamespaceAtIndex(index),
                                                                                                            psviAttributes->getAttributeNameAtIndex(index));
            if(pAttrNode!=NULL)
            {
                DOMTypeInfoImpl* typeInfo=new (getDocument()) DOMTypeInfoImpl();
                typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validity, attrInfo->getValidity());
                typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validation_Attempted, attrInfo->getValidationAttempted());
                if(attrInfo->getTypeDefinition())
                {
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, XSTypeDefinition::SIMPLE_TYPE);
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, attrInfo->getTypeDefinition()->getAnonymous());
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace,
                        fDocument->getPooledString(attrInfo->getTypeDefinition()->getNamespace()));
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name,
                        fDocument->getPooledString(attrInfo->getTypeDefinition()->getName()));
                }
                else if(attrInfo->getValidity()==PSVIItem::VALIDITY_VALID)
                {
                    // if we are valid but we don't have a type validator, we are xs:anySimpleType
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, XSTypeDefinition::SIMPLE_TYPE);
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, false);
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name, SchemaSymbols::fgDT_ANYSIMPLETYPE);
                }
                if(attrInfo->getMemberTypeDefinition())
                {
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Anonymous, attrInfo->getMemberTypeDefinition()->getAnonymous());
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Namespace,
                        fDocument->getPooledString(attrInfo->getMemberTypeDefinition()->getNamespace()));
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Name,
                        fDocument->getPooledString(attrInfo->getMemberTypeDefinition()->getName()));
                }
                typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Default, fDocument->getPooledString(attrInfo->getSchemaDefault()));
                typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Normalized_Value, fDocument->getPooledString(attrInfo->getSchemaNormalizedValue()));
                typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Schema_Specified, true);
                ((DOMAttrImpl*)pAttrNode)->setSchemaTypeInfo(typeInfo);
            }
        }
    }
    // associate the info now; if the user wants, she can override what we did
    if(fPSVIHandler)
        fPSVIHandler->handleAttributesPSVI(localName, uri, psviAttributes);
}